

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss_test.cc
# Opt level: O1

void __thiscall
xLearn::CROSS_ENTROPY_LOSS_Evalute_Test::TestBody(CROSS_ENTROPY_LOSS_Evalute_Test *this)

{
  pointer pfVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  byte bVar18;
  bool bVar19;
  uint uVar20;
  Score *pSVar21;
  ThreadPool *this_00;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  ushort uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 in_XMM6 [16];
  AssertionResult gtest_ar;
  real_t val;
  vector<float,_std::allocator<float>_> label;
  vector<float,_std::allocator<float>_> pred;
  CrossEntropyLoss loss;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  float local_84;
  vector<float,_std::allocator<float>_> local_80;
  vector<float,_std::allocator<float>_> local_68;
  CrossEntropyLoss local_50;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&local_68,(ulong)kLine,(allocator_type *)&local_50);
  if ((long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar22 = (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    auVar26 = vpbroadcastq_avx512f();
    uVar23 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vbroadcastss_avx512f(ZEXT416(0x461c4000));
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vporq_avx512f(auVar30,auVar27);
      auVar30 = vporq_avx512f(auVar30,auVar28);
      uVar16 = vpcmpuq_avx512f(auVar30,auVar26,2);
      uVar17 = vpcmpuq_avx512f(auVar31,auVar26,2);
      bVar18 = (byte)uVar17;
      uVar25 = CONCAT11(bVar18,(byte)uVar16);
      pfVar1 = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23;
      bVar19 = (bool)((byte)uVar16 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (bool)(bVar18 >> 1 & 1);
      bVar10 = (bool)(bVar18 >> 2 & 1);
      bVar11 = (bool)(bVar18 >> 3 & 1);
      bVar12 = (bool)(bVar18 >> 4 & 1);
      bVar13 = (bool)(bVar18 >> 5 & 1);
      bVar14 = (bool)(bVar18 >> 6 & 1);
      *pfVar1 = (float)((uint)bVar19 * auVar29._0_4_ | (uint)!bVar19 * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar2 * auVar29._4_4_ | (uint)!bVar2 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)bVar5 * auVar29._16_4_ | (uint)!bVar5 * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar6 * auVar29._20_4_ | (uint)!bVar6 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar7 * auVar29._24_4_ | (uint)!bVar7 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)bVar8 * auVar29._28_4_ | (uint)!bVar8 * (int)pfVar1[7]);
      pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar29._32_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
      pfVar1[9] = (float)((uint)bVar9 * auVar29._36_4_ | (uint)!bVar9 * (int)pfVar1[9]);
      pfVar1[10] = (float)((uint)bVar10 * auVar29._40_4_ | (uint)!bVar10 * (int)pfVar1[10]);
      pfVar1[0xb] = (float)((uint)bVar11 * auVar29._44_4_ | (uint)!bVar11 * (int)pfVar1[0xb]);
      pfVar1[0xc] = (float)((uint)bVar12 * auVar29._48_4_ | (uint)!bVar12 * (int)pfVar1[0xc]);
      pfVar1[0xd] = (float)((uint)bVar13 * auVar29._52_4_ | (uint)!bVar13 * (int)pfVar1[0xd]);
      pfVar1[0xe] = (float)((uint)bVar14 * auVar29._56_4_ | (uint)!bVar14 * (int)pfVar1[0xe]);
      pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar29._60_4_ |
                           (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
      uVar23 = uVar23 + 0x10;
    } while ((lVar22 + (ulong)(lVar22 == 0) + 0xf & 0xfffffffffffffff0) != uVar23);
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&local_80,(ulong)kLine,(allocator_type *)&local_50);
  if ((long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar22 = (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    auVar26 = vpbroadcastq_avx512f();
    uVar23 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vporq_avx512f(auVar30,auVar27);
      auVar30 = vporq_avx512f(auVar30,auVar28);
      uVar16 = vpcmpuq_avx512f(auVar30,auVar26,2);
      uVar17 = vpcmpuq_avx512f(auVar31,auVar26,2);
      bVar18 = (byte)uVar17;
      uVar25 = CONCAT11(bVar18,(byte)uVar16);
      pfVar1 = local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23;
      bVar19 = (bool)((byte)uVar16 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (bool)(bVar18 >> 1 & 1);
      bVar10 = (bool)(bVar18 >> 2 & 1);
      bVar11 = (bool)(bVar18 >> 3 & 1);
      bVar12 = (bool)(bVar18 >> 4 & 1);
      bVar13 = (bool)(bVar18 >> 5 & 1);
      bVar14 = (bool)(bVar18 >> 6 & 1);
      *pfVar1 = (float)((uint)bVar19 * auVar29._0_4_ | (uint)!bVar19 * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar2 * auVar29._4_4_ | (uint)!bVar2 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)bVar5 * auVar29._16_4_ | (uint)!bVar5 * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar6 * auVar29._20_4_ | (uint)!bVar6 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar7 * auVar29._24_4_ | (uint)!bVar7 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)bVar8 * auVar29._28_4_ | (uint)!bVar8 * (int)pfVar1[7]);
      pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar29._32_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
      pfVar1[9] = (float)((uint)bVar9 * auVar29._36_4_ | (uint)!bVar9 * (int)pfVar1[9]);
      pfVar1[10] = (float)((uint)bVar10 * auVar29._40_4_ | (uint)!bVar10 * (int)pfVar1[10]);
      pfVar1[0xb] = (float)((uint)bVar11 * auVar29._44_4_ | (uint)!bVar11 * (int)pfVar1[0xb]);
      pfVar1[0xc] = (float)((uint)bVar12 * auVar29._48_4_ | (uint)!bVar12 * (int)pfVar1[0xc]);
      pfVar1[0xd] = (float)((uint)bVar13 * auVar29._52_4_ | (uint)!bVar13 * (int)pfVar1[0xd]);
      pfVar1[0xe] = (float)((uint)bVar14 * auVar29._56_4_ | (uint)!bVar14 * (int)pfVar1[0xe]);
      pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar29._60_4_ |
                           (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
      uVar23 = uVar23 + 0x10;
    } while ((lVar22 + (ulong)(lVar22 == 0) + 0xf & 0xfffffffffffffff0) != uVar23);
  }
  local_50.super_Loss.loss_sum_ = 0.0;
  local_50.super_Loss.total_example_ = 0;
  local_50.super_Loss._vptr_Loss = (_func_int **)&PTR__Loss_00166dc0;
  pSVar21 = (Score *)operator_new(0x58);
  (pSVar21->opt_type_)._M_dataplus._M_p = (pointer)&(pSVar21->opt_type_).field_2;
  (pSVar21->opt_type_)._M_string_length = 0;
  (pSVar21->opt_type_).field_2._M_local_buf[0] = '\0';
  pSVar21->_vptr_Score = (_func_int **)&PTR__Score_00167418;
  pSVar21[1]._vptr_Score = (_func_int **)0x0;
  pSVar21[1].learning_rate_ = 0.0;
  pSVar21[1].regu_lambda_ = 0.0;
  pSVar21[1].alpha_ = 0.0;
  pSVar21[1].beta_ = 0.0;
  uVar20 = std::thread::hardware_concurrency();
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(ulong)uVar20);
  local_50.super_Loss.norm_ = true;
  local_50.super_Loss.threadNumber_ =
       (long)(this_00->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this_00->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_50.super_Loss.lock_free_ = false;
  local_50.super_Loss.batch_size_ = 0;
  local_50.super_Loss.score_func_ = pSVar21;
  local_50.super_Loss.pool_ = this_00;
  CrossEntropyLoss::Evalute(&local_50,&local_68,&local_80);
  auVar15 = vcvtusi2ss_avx512f(in_XMM6,local_50.super_Loss.total_example_);
  local_84 = local_50.super_Loss.loss_sum_ / auVar15._0_4_;
  local_a8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3eb0c6f7a0b5ed8d;
  testing::internal::CmpHelperLT<float,double>
            (local_98,"val","0.000001",&local_84,(double *)&local_a8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar24 = "";
    }
    else {
      pcVar24 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss_test.cc"
               ,0x33,pcVar24);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar19 = testing::internal::IsTrue(true);
      if ((bVar19) &&
         (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a8.ptr_ + 8))();
      }
      local_a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar22 = (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    auVar26 = vpbroadcastq_avx512f();
    uVar23 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vbroadcastss_avx512f(ZEXT416(0xc61c4000));
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vporq_avx512f(auVar30,auVar27);
      auVar30 = vporq_avx512f(auVar30,auVar28);
      uVar16 = vpcmpuq_avx512f(auVar30,auVar26,2);
      uVar17 = vpcmpuq_avx512f(auVar31,auVar26,2);
      bVar18 = (byte)uVar17;
      uVar25 = CONCAT11(bVar18,(byte)uVar16);
      pfVar1 = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23;
      bVar19 = (bool)((byte)uVar16 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (bool)(bVar18 >> 1 & 1);
      bVar10 = (bool)(bVar18 >> 2 & 1);
      bVar11 = (bool)(bVar18 >> 3 & 1);
      bVar12 = (bool)(bVar18 >> 4 & 1);
      bVar13 = (bool)(bVar18 >> 5 & 1);
      bVar14 = (bool)(bVar18 >> 6 & 1);
      *pfVar1 = (float)((uint)bVar19 * auVar29._0_4_ | (uint)!bVar19 * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar2 * auVar29._4_4_ | (uint)!bVar2 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)bVar5 * auVar29._16_4_ | (uint)!bVar5 * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar6 * auVar29._20_4_ | (uint)!bVar6 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar7 * auVar29._24_4_ | (uint)!bVar7 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)bVar8 * auVar29._28_4_ | (uint)!bVar8 * (int)pfVar1[7]);
      pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar29._32_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
      pfVar1[9] = (float)((uint)bVar9 * auVar29._36_4_ | (uint)!bVar9 * (int)pfVar1[9]);
      pfVar1[10] = (float)((uint)bVar10 * auVar29._40_4_ | (uint)!bVar10 * (int)pfVar1[10]);
      pfVar1[0xb] = (float)((uint)bVar11 * auVar29._44_4_ | (uint)!bVar11 * (int)pfVar1[0xb]);
      pfVar1[0xc] = (float)((uint)bVar12 * auVar29._48_4_ | (uint)!bVar12 * (int)pfVar1[0xc]);
      pfVar1[0xd] = (float)((uint)bVar13 * auVar29._52_4_ | (uint)!bVar13 * (int)pfVar1[0xd]);
      pfVar1[0xe] = (float)((uint)bVar14 * auVar29._56_4_ | (uint)!bVar14 * (int)pfVar1[0xe]);
      pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar29._60_4_ |
                           (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
      uVar23 = uVar23 + 0x10;
    } while ((lVar22 + (ulong)(lVar22 == 0) + 0xf & 0xfffffffffffffff0) != uVar23);
  }
  if ((long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar22 = (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    auVar26 = vpbroadcastq_avx512f();
    uVar23 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vporq_avx512f(auVar30,auVar27);
      auVar30 = vporq_avx512f(auVar30,auVar28);
      uVar16 = vpcmpuq_avx512f(auVar30,auVar26,2);
      uVar17 = vpcmpuq_avx512f(auVar31,auVar26,2);
      bVar18 = (byte)uVar17;
      uVar25 = CONCAT11(bVar18,(byte)uVar16);
      pfVar1 = local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23;
      bVar19 = (bool)((byte)uVar16 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (bool)(bVar18 >> 1 & 1);
      bVar10 = (bool)(bVar18 >> 2 & 1);
      bVar11 = (bool)(bVar18 >> 3 & 1);
      bVar12 = (bool)(bVar18 >> 4 & 1);
      bVar13 = (bool)(bVar18 >> 5 & 1);
      bVar14 = (bool)(bVar18 >> 6 & 1);
      *pfVar1 = (float)((uint)bVar19 * auVar29._0_4_ | (uint)!bVar19 * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar2 * auVar29._4_4_ | (uint)!bVar2 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)bVar5 * auVar29._16_4_ | (uint)!bVar5 * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar6 * auVar29._20_4_ | (uint)!bVar6 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar7 * auVar29._24_4_ | (uint)!bVar7 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)bVar8 * auVar29._28_4_ | (uint)!bVar8 * (int)pfVar1[7]);
      pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar29._32_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
      pfVar1[9] = (float)((uint)bVar9 * auVar29._36_4_ | (uint)!bVar9 * (int)pfVar1[9]);
      pfVar1[10] = (float)((uint)bVar10 * auVar29._40_4_ | (uint)!bVar10 * (int)pfVar1[10]);
      pfVar1[0xb] = (float)((uint)bVar11 * auVar29._44_4_ | (uint)!bVar11 * (int)pfVar1[0xb]);
      pfVar1[0xc] = (float)((uint)bVar12 * auVar29._48_4_ | (uint)!bVar12 * (int)pfVar1[0xc]);
      pfVar1[0xd] = (float)((uint)bVar13 * auVar29._52_4_ | (uint)!bVar13 * (int)pfVar1[0xd]);
      pfVar1[0xe] = (float)((uint)bVar14 * auVar29._56_4_ | (uint)!bVar14 * (int)pfVar1[0xe]);
      pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar29._60_4_ |
                           (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
      uVar23 = uVar23 + 0x10;
    } while ((lVar22 + (ulong)(lVar22 == 0) + 0xf & 0xfffffffffffffff0) != uVar23);
  }
  CrossEntropyLoss::Evalute(&local_50,&local_68,&local_80);
  auVar15 = vcvtusi2ss_avx512f(in_XMM6,local_50.super_Loss.total_example_);
  local_84 = local_50.super_Loss.loss_sum_ / auVar15._0_4_;
  local_a8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3eb0c6f7a0b5ed8d;
  testing::internal::CmpHelperLT<float,double>
            (local_98,"val","0.000001",&local_84,(double *)&local_a8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar24 = "";
    }
    else {
      pcVar24 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss_test.cc"
               ,0x3d,pcVar24);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar19 = testing::internal::IsTrue(true);
      if ((bVar19) &&
         (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a8.ptr_ + 8))();
      }
      local_a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CROSS_ENTROPY_LOSS, Evalute) {
  // Create pred vector
  std::vector<real_t> pred(kLine);
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = 10000;
  }
  // Create label vector
  std::vector<real_t> label(kLine);
  for (int i = 0; i < label.size(); ++i) {
    label[i] = 1.0;
  }
  // Create loss
  CrossEntropyLoss loss;
  Score* score = new FMScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  loss.Evalute(pred, label);
  real_t val = loss.GetLoss();
  EXPECT_LT(val, 0.000001);
  // Test2
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = -10000;
  }
  for (int i = 0; i < label.size(); ++i) {
    label[i] = -1.0;
  }
  loss.Evalute(pred, label);
  val = loss.GetLoss();
  EXPECT_LT(val, 0.000001);
}